

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int generate_by_miniscript_thresh
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  miniscript_node_t *node_00;
  ulong uVar5;
  bool bVar6;
  size_t output_len;
  size_t local_50;
  size_t local_48;
  miniscript_node_t *local_40;
  ulong *local_38;
  
  uVar3 = 0x208;
  if (script_len < 0x208) {
    uVar3 = script_len;
  }
  iVar1 = -2;
  if ((node->child != (miniscript_node_t *)0x0) &&
     ((parent == (miniscript_node_t *)0x0 || (parent->info != (miniscript_item_t *)0x0)))) {
    node_00 = node->child->next;
    local_48 = script_len;
    local_40 = node;
    local_38 = write_len;
    if (node_00 == (miniscript_node_t *)0x0) {
      uVar5 = 0;
    }
    else {
      lVar4 = 0;
      uVar5 = 0;
      do {
        local_50 = 0;
        iVar1 = generate_script_from_miniscript
                          (node_00,local_40,derive_child_num,script + uVar5,~uVar5 + local_48,
                           &local_50);
        if (iVar1 != 0) {
          return iVar1;
        }
        uVar5 = uVar5 + local_50;
        if (uVar3 <= uVar5) {
          return -2;
        }
        bVar6 = lVar4 != 0;
        lVar4 = lVar4 + -1;
        if (bVar6) {
          if (uVar3 <= uVar5 + 1) {
            return -2;
          }
          script[uVar5] = 0x93;
          uVar5 = uVar5 + 1;
        }
        node_00 = node_00->next;
      } while (node_00 != (miniscript_node_t *)0x0);
    }
    iVar1 = generate_script_from_miniscript
                      (local_40->child,local_40,derive_child_num,script + uVar5,~uVar5 + local_48,
                       &local_50);
    if (iVar1 == 0) {
      uVar2 = local_50 + uVar5 + 1;
      iVar1 = -2;
      if (uVar2 < uVar3) {
        script[local_50 + uVar5] = 0x87;
        *local_38 = uVar2;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

static int generate_by_miniscript_thresh(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    /* [X1] [X2] ADD ... [Xn] ADD <k> EQUAL */
    int ret;
    size_t output_len;
    size_t offset = 0;
    size_t count = 0;
    struct miniscript_node_t *child = node->child;
    size_t check_len = (DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE > script_len) ? script_len : DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE;

    if (!child || (parent && !parent->info))
        return WALLY_EINVAL;

    child = child->next;
    while (child != NULL) {
        output_len = 0;
        ret = generate_script_from_miniscript(child,
                                              node,
                                              derive_child_num,
                                              &script[offset],
                                              script_len - offset - 1,
                                              &output_len);
        if (ret != WALLY_OK)
            return ret;

        ++count;
        offset += output_len;
        if (offset >= check_len)
            return WALLY_EINVAL;

        if (count != 1) {
            if (offset + 1 >= check_len)
                return WALLY_EINVAL;

            script[offset] = OP_ADD;
            ++offset;
        }

        child = child->next;
    }

    ret = generate_script_from_miniscript(node->child,
                                          node,
                                          derive_child_num,
                                          &script[offset],
                                          script_len - offset - 1,
                                          &output_len);
    if (ret != WALLY_OK)
        return ret;

    offset += output_len;
    if (offset + 1 >= check_len)
        return WALLY_EINVAL;

    script[offset] = OP_EQUAL;
    *write_len = offset + 1;
    return WALLY_OK;
}